

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.c
# Opt level: O3

void statemachine_encode_char(char schr,char *output,size_t len)

{
  char *pcVar1;
  int iVar2;
  undefined7 in_register_00000039;
  
  iVar2 = (int)CONCAT71(in_register_00000039,schr);
  if (iVar2 == 0x5c) {
    pcVar1 = "\\\\";
  }
  else if (iVar2 == 0x27) {
    pcVar1 = "\\\'";
  }
  else {
    if ((byte)(schr - 0x20U) < 0x5f) {
      pcVar1 = "%c";
LAB_00103e53:
      snprintf(output,len,pcVar1);
      goto LAB_00103e60;
    }
    if (schr == '\t') {
      pcVar1 = "\\t";
    }
    else if (schr == '\r') {
      pcVar1 = "\\r";
    }
    else {
      if (schr != '\n') {
        pcVar1 = "\\x%.2x";
        goto LAB_00103e53;
      }
      pcVar1 = "\\n";
    }
  }
  strncpy(output,pcVar1,len);
LAB_00103e60:
  output[len - 1] = '\0';
  return;
}

Assistant:

void statemachine_encode_char(char schr, char *output, size_t len)
{
  unsigned char chr = schr;
  if (chr == '\'') {
    strncpy(output, "\\'", len);
  } else if (chr == '\\') {
    strncpy(output, "\\\\", len);

  /* Like isprint() but not dependent on locale. */
  } else if (chr >= 32 && chr <= 126) {
    snprintf(output, len, "%c", chr);
  } else if (chr == '\n') {
    strncpy(output, "\\n", len);
  } else if (chr == '\r') {
    strncpy(output, "\\r", len);
  } else if (chr == '\t') {
    strncpy(output, "\\t", len);
  } else {
    snprintf(output, len, "\\x%.2x", chr);
  }

  output[len - 1] = '\0';
}